

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_negate_unchecked(secp256k1_fe *r,secp256k1_fe *a,int m)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  secp256k1_fe_verify(a);
  secp256k1_fe_verify_magnitude(a,m);
  uVar1 = (ulong)(m + 1U);
  uVar3 = (ulong)(uint)m * 0x1ffffffffffffe;
  if (uVar1 * 0x1ffffdfffff85e < uVar3) {
    pcVar4 = "test condition failed: 0xFFFFEFFFFFC2FULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m"
    ;
    uVar2 = 0x13b;
  }
  else {
    uVar5 = uVar1 * 0x1ffffffffffffe;
    if (uVar5 < uVar3) {
      pcVar4 = 
      "test condition failed: 0xFFFFFFFFFFFFFULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m";
      uVar2 = 0x13c;
    }
    else {
      if ((ulong)(uint)m * 0x1fffffffffffe <= uVar1 * 0x1fffffffffffe) {
        r->n[0] = uVar1 * 0x1ffffdfffff85e - a->n[0];
        r->n[1] = uVar5 - a->n[1];
        r->n[2] = uVar5 - a->n[2];
        r->n[3] = uVar5 - a->n[3];
        r->n[4] = uVar1 * 0x1fffffffffffe - a->n[4];
        r->magnitude = m + 1U;
        r->normalized = 0;
        secp256k1_fe_verify(r);
        return;
      }
      pcVar4 = 
      "test condition failed: 0x0FFFFFFFFFFFFULL * 2 * (m + 1) >= 0x0FFFFFFFFFFFFULL * 2 * m";
      uVar2 = 0x13d;
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_negate_unchecked(secp256k1_fe *r, const secp256k1_fe *a, int m) {
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(m >= 0 && m <= 31);
    SECP256K1_FE_VERIFY_MAGNITUDE(a, m);

    secp256k1_fe_impl_negate_unchecked(r, a, m);
    r->magnitude = m + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}